

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

ssize_t __thiscall
ktx::ValidationContextMemory::read
          (ValidationContextMemory *this,int __fd,void *__buf,size_t __nbytes)

{
  void *pvVar1;
  undefined4 in_register_00000034;
  ulong uVar2;
  size_t bytesAvailable;
  unsigned_long *in_stack_000000a0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_000000a8;
  unsigned_long *in_stack_000000b0;
  unsigned_long *in_stack_000000b8;
  IssueFatal *in_stack_000000c0;
  ValidationContext *in_stack_000000c8;
  ulong local_48;
  
  uVar2 = CONCAT44(in_register_00000034,__fd);
  if (this->memorySize < uVar2) {
    local_48 = 0;
  }
  else {
    local_48 = this->memorySize - uVar2;
  }
  if (local_48 < __nbytes) {
    ValidationContext::
    fatal<unsigned_long&,unsigned_long&,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long_const&>
              (in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,
               in_stack_000000a8,in_stack_000000a0);
  }
  pvVar1 = memcpy(__buf,this->memoryData + uVar2,__nbytes);
  return (ssize_t)pvVar1;
}

Assistant:

virtual void read(std::size_t offset, void* readDst, std::size_t readSize, std::string_view name) override {
        const auto bytesAvailable = offset > memorySize ? 0 : memorySize - offset;

        if (bytesAvailable < readSize)
            fatal(IOError::UnexpectedEOF, readSize, offset, name, bytesAvailable);

        std::memcpy(readDst, memoryData + offset, readSize);
    }